

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# readmtm.c
# Opt level: O1

int it_mtm_assemble_pattern(IT_PATTERN *pattern,uchar *track,unsigned_short *sequence,int n_rows)

{
  byte bVar1;
  ushort uVar2;
  IT_ENTRY *entry;
  long lVar3;
  byte bVar4;
  long lVar5;
  uchar *puVar6;
  int iVar7;
  
  pattern->n_rows = n_rows;
  pattern->n_entries = n_rows;
  lVar5 = 0;
  do {
    uVar2 = sequence[lVar5];
    if (uVar2 != 0 && 0 < n_rows) {
      puVar6 = track + (ulong)(((uint)uVar2 + (uint)uVar2 * 2) * 0x40 - 0xc0) + 2;
      iVar7 = n_rows;
      do {
        if (((puVar6[-2] != '\0') || (puVar6[-1] != '\0')) || (*puVar6 != '\0')) {
          pattern->n_entries = pattern->n_entries + 1;
        }
        puVar6 = puVar6 + 3;
        iVar7 = iVar7 + -1;
      } while (iVar7 != 0);
    }
    lVar5 = lVar5 + 1;
  } while (lVar5 != 0x20);
  entry = (IT_ENTRY *)malloc((long)pattern->n_entries * 7);
  if (entry == (IT_ENTRY *)0x0) {
    iVar7 = -1;
  }
  else {
    pattern->entry = entry;
    if (0 < n_rows) {
      iVar7 = 0;
      do {
        lVar5 = 0;
        do {
          uVar2 = sequence[lVar5];
          if ((uVar2 != 0) &&
             (((lVar3 = (long)(int)(((uint)uVar2 + (uint)uVar2 * 2) * 0x40 + iVar7 * 3 + -0xc0),
               track[lVar3] != '\0' || (track[lVar3 + 1] != '\0')) || (track[lVar3 + 2] != '\0'))))
          {
            entry->channel = (uchar)lVar5;
            entry->mask = '\0';
            bVar4 = track[lVar3];
            bVar1 = track[lVar3 + 1];
            if (3 < bVar4) {
              entry->mask = '\x01';
              entry->note = (bVar4 >> 2) + 0x18;
            }
            bVar4 = (bVar4 & 3) << 4 | bVar1 >> 4;
            if (bVar4 != 0) {
              entry->mask = entry->mask | 2;
              entry->instrument = bVar4;
            }
            _dumb_it_xm_convert_effect(track[lVar3 + 1] & 0xf,(uint)track[lVar3 + 2],entry,1);
            if (entry->mask != '\0') {
              entry = entry + 1;
            }
          }
          lVar5 = lVar5 + 1;
        } while (lVar5 != 0x20);
        entry->channel = 0xff;
        entry = entry + 1;
        iVar7 = iVar7 + 1;
      } while (iVar7 != n_rows);
    }
    pattern->n_entries = ((int)entry - *(int *)&pattern->entry) * -0x49249249;
    iVar7 = 0;
  }
  return iVar7;
}

Assistant:

static int it_mtm_assemble_pattern(IT_PATTERN *pattern, const unsigned char * track, const unsigned short * sequence, int n_rows)
{
	int n, o, note, sample;
	const unsigned char * t;
	IT_ENTRY * entry;

	pattern->n_rows = n_rows;
	pattern->n_entries = n_rows;

	for (n = 0; n < 32; n++) {
		if (sequence[n]) {
			t = &track[192 * (sequence[n] - 1)];
			for (o = 0; o < n_rows; o++) {
				if (t[0] || t[1] || t[2]) pattern->n_entries++;
				t += 3;
			}
		}
	}

	entry = malloc(pattern->n_entries * sizeof(*entry));
	if (!entry) return -1;
	pattern->entry = entry;

	for (n = 0; n < n_rows; n++) {
		for (o = 0; o < 32; o++) {
			if (sequence[o]) {
				t = &track[192 * (sequence[o] - 1) + (n * 3)];
				if (t[0] || t[1] || t[2]) {
					entry->channel = o;
					entry->mask = 0;
					note = t[0] >> 2;
					sample = ((t[0] << 4) | (t[1] >> 4)) & 0x3F;

					if (note) {
						entry->mask |= IT_ENTRY_NOTE;
						entry->note = note + 24;
					}

					if (sample) {
						entry->mask |= IT_ENTRY_INSTRUMENT;
						entry->instrument = sample;
					}

					_dumb_it_xm_convert_effect(t[1] & 0xF, t[2], entry, 1);

					if (entry->mask) entry++;
				}
			}
		}
		IT_SET_END_ROW(entry);
		entry++;
	}

	pattern->n_entries = (int)(entry - pattern->entry);

	return 0;
}